

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_ps.c
# Opt level: O2

MPP_RET avs2d_parse_sequence_header(Avs2dCtx_t *p_dec)

{
  BitReadCtx_t *bitctx;
  byte bVar1;
  RK_U32 (*paRVar2) [64];
  MPP_RET MVar3;
  uint uVar4;
  MPP_RET MVar5;
  RK_U32 *pRVar6;
  char *fmt;
  ulong uVar7;
  Avs2dRps_t *rps;
  RK_S32 _out;
  char local_5d;
  int local_5c;
  long local_58;
  ulong local_50;
  RK_U32 (*local_48) [64];
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  bitctx = &p_dec->bitctx;
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_ps","Bitread buf %p, data %p, buf_len %d, left %d\n",
               "avs2d_parse_sequence_header",(p_dec->bitctx).buf,(p_dec->bitctx).data_,
               (ulong)(uint)(p_dec->bitctx).buf_len,(ulong)(p_dec->bitctx).bytes_left_);
  }
  memset(&p_dec->vsh,0,0x530);
  MVar3 = mpp_read_bits(bitctx,8,&_out);
  (p_dec->bitctx).ret = MVar3;
  if (MVar3 != MPP_OK) {
    return MVar3;
  }
  uVar7 = (ulong)(_out & 0xff);
  (p_dec->vsh).profile_id = (byte)_out;
  if (((byte)_out < 0x23) && ((0x500040000U >> (uVar7 & 0x3f) & 1) != 0)) {
    MVar3 = mpp_read_bits(bitctx,8,&_out);
    (p_dec->bitctx).ret = MVar3;
    if (MVar3 != MPP_OK) {
      return MVar3;
    }
    (p_dec->vsh).level_id = (byte)_out;
    if ((byte)_out < 0x6b) {
      MVar3 = mpp_read_bits(bitctx,1,&_out);
      (p_dec->bitctx).ret = MVar3;
      if (MVar3 != MPP_OK) {
        return MVar3;
      }
      (p_dec->vsh).progressive_sequence = (byte)_out;
      MVar3 = mpp_read_bits(bitctx,1,&_out);
      (p_dec->bitctx).ret = MVar3;
      if (MVar3 != MPP_OK) {
        return MVar3;
      }
      (p_dec->vsh).field_coded_sequence = (byte)_out;
      MVar3 = mpp_read_bits(bitctx,0xe,&_out);
      (p_dec->bitctx).ret = MVar3;
      if (MVar3 != MPP_OK) {
        return MVar3;
      }
      (p_dec->vsh).horizontal_size = _out;
      MVar3 = mpp_read_bits(bitctx,0xe,&_out);
      (p_dec->bitctx).ret = MVar3;
      if (MVar3 != MPP_OK) {
        return MVar3;
      }
      (p_dec->vsh).vertical_size = _out;
      if ((uint)_out < 0x10 || (p_dec->vsh).horizontal_size < 0x10) {
        _mpp_log_l(2,"avs2d_ps","invalid sequence width(%d), height(%d).\n",
                   "avs2d_parse_sequence_header");
        return MPP_NOK;
      }
      MVar3 = mpp_read_bits(bitctx,2,&_out);
      (p_dec->bitctx).ret = MVar3;
      if (MVar3 != MPP_OK) {
        return MVar3;
      }
      (p_dec->vsh).chroma_format = (RK_U8)_out;
      if ((RK_U8)_out == '\x01') {
        MVar3 = mpp_read_bits(bitctx,3,&_out);
        (p_dec->bitctx).ret = MVar3;
        if (MVar3 != MPP_OK) {
          return MVar3;
        }
        (p_dec->vsh).sample_precision = (byte)_out;
        if ((p_dec->vsh).profile_id == '\"') {
          MVar3 = mpp_read_bits(bitctx,3,&_out);
          (p_dec->bitctx).ret = MVar3;
          if (MVar3 != MPP_OK) {
            return MVar3;
          }
          uVar7 = (ulong)(_out & 0xff);
          (p_dec->vsh).encoding_precision = (byte)_out;
          bVar1 = (p_dec->vsh).sample_precision;
        }
        else {
          (p_dec->vsh).encoding_precision = '\x01';
          uVar7 = 1;
          bVar1 = (byte)_out;
        }
        (p_dec->vsh).bit_depth = (char)uVar7 * '\x02' + '\x06';
        if ((byte)(bVar1 - 3) < 0xfe) {
          uVar7 = (ulong)bVar1;
          fmt = "sample_precision 0x%02x is not supported.\n";
        }
        else if ((byte)((char)uVar7 - 3U) < 0xfe) {
          fmt = "encoding_precision 0x%02x is not supported.\n";
        }
        else {
          MVar3 = mpp_read_bits(bitctx,4,&_out);
          (p_dec->bitctx).ret = MVar3;
          if (MVar3 != MPP_OK) {
            return MVar3;
          }
          (p_dec->vsh).aspect_ratio = (byte)_out;
          MVar3 = mpp_read_bits(bitctx,4,&_out);
          (p_dec->bitctx).ret = MVar3;
          if (MVar3 != MPP_OK) {
            return MVar3;
          }
          (p_dec->vsh).frame_rate_code = (byte)_out;
          MVar3 = mpp_read_bits(bitctx,0x12,&_out);
          (p_dec->bitctx).ret = MVar3;
          if (MVar3 != MPP_OK) {
            return MVar3;
          }
          (p_dec->vsh).bit_rate = _out << 0xc;
          MVar3 = mpp_read_bits(bitctx,1,&_out);
          (p_dec->bitctx).ret = MVar3;
          if ((MVar3 == MPP_OK) && ((byte)_out != '\x01')) {
            if (((byte)avs2d_parse_debug & 4) != 0) {
              _mpp_log_l(4,"avs2d_ps","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,
                         0x157);
            }
          }
          else if (MVar3 != MPP_OK) {
            return MVar3;
          }
          MVar3 = mpp_read_bits(bitctx,0xc,&_out);
          (p_dec->bitctx).ret = MVar3;
          if (MVar3 != MPP_OK) {
            return MVar3;
          }
          pRVar6 = &(p_dec->vsh).bit_rate;
          *pRVar6 = *pRVar6 + _out;
          MVar3 = mpp_read_bits(bitctx,1,&_out);
          (p_dec->bitctx).ret = MVar3;
          if (MVar3 != MPP_OK) {
            return MVar3;
          }
          (p_dec->vsh).low_delay = (byte)_out;
          MVar3 = mpp_read_bits(bitctx,1,&_out);
          (p_dec->bitctx).ret = MVar3;
          if ((MVar3 == MPP_OK) && ((byte)_out != '\x01')) {
            if (((byte)avs2d_parse_debug & 4) != 0) {
              _mpp_log_l(4,"avs2d_ps","expected marker_bit 1 while received 0(%d).\n",(char *)0x0,
                         0x15b);
            }
          }
          else if (MVar3 != MPP_OK) {
            return MVar3;
          }
          MVar3 = mpp_read_bits(bitctx,1,&_out);
          (p_dec->bitctx).ret = MVar3;
          if (MVar3 != MPP_OK) {
            return MVar3;
          }
          (p_dec->vsh).enable_temporal_id = (byte)_out;
          MVar3 = mpp_read_bits(bitctx,0x12,&_out);
          (p_dec->bitctx).ret = MVar3;
          if (MVar3 != MPP_OK) {
            return MVar3;
          }
          (p_dec->vsh).bbv_buffer_size = _out;
          MVar3 = mpp_read_bits(bitctx,3,&_out);
          (p_dec->bitctx).ret = MVar3;
          if (MVar3 != MPP_OK) {
            return MVar3;
          }
          (p_dec->vsh).lcu_size = (RK_U8)_out;
          if (0xfc < (byte)((RK_U8)_out - 7)) {
            MVar3 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) {
              return MVar3;
            }
            (p_dec->vsh).enable_weighted_quant = (byte)_out;
            if ((byte)_out != '\0') {
              MVar3 = mpp_read_bits(bitctx,1,&_out);
              (p_dec->bitctx).ret = MVar3;
              if (MVar3 == MPP_OK) {
                local_48 = (p_dec->vsh).seq_wq_matrix;
                local_5d = (byte)_out;
                local_3c = _out & 0xff;
                for (local_58 = 0; local_58 != 2; local_58 = local_58 + 1) {
                  uVar4 = 4 << ((byte)local_58 & 0x1f);
                  local_50 = (ulong)uVar4;
                  if (local_5d == '\0') {
                    pRVar6 = g_WqMDefault8x8;
                    if (local_58 == 0) {
                      pRVar6 = g_WqMDefault4x4;
                    }
                    local_50 = (ulong)(uVar4 << ((byte)local_58 & 0x1f | 2));
                    for (uVar7 = 0; local_50 != uVar7; uVar7 = uVar7 + 1) {
                      (*local_48)[uVar7] = pRVar6[uVar7];
                    }
                  }
                  else if (local_3c == 1) {
                    local_40 = (uint)local_58 | 2;
                    local_38 = local_50;
                    for (local_5c = 0; paRVar2 = local_48, local_5c != (int)local_50;
                        local_5c = local_5c + 1) {
                      uVar4 = local_5c << ((byte)local_40 & 0x1f);
                      for (uVar7 = 0; local_38 != uVar7; uVar7 = uVar7 + 1) {
                        MVar3 = mpp_read_ue(bitctx,(RK_U32 *)&_out);
                        (p_dec->bitctx).ret = MVar3;
                        if (MVar3 != MPP_OK) goto LAB_0017f140;
                        (*paRVar2)[uVar4 + uVar7] = _out;
                      }
                    }
                  }
                  local_48 = local_48 + 1;
                }
              }
            }
LAB_0017f140:
            MVar3 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) {
              return MVar3;
            }
            (p_dec->vsh).enable_background_picture = (byte)_out ^ 1;
            MVar3 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) {
              return MVar3;
            }
            (p_dec->vsh).enable_mhp_skip = (byte)_out;
            MVar3 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) {
              return MVar3;
            }
            (p_dec->vsh).enable_dhp = (byte)_out;
            MVar3 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) {
              return MVar3;
            }
            (p_dec->vsh).enable_wsm = (byte)_out;
            MVar3 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) {
              return MVar3;
            }
            (p_dec->vsh).enable_amp = (byte)_out;
            MVar3 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) {
              return MVar3;
            }
            (p_dec->vsh).enable_nsqt = (byte)_out;
            MVar3 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) {
              return MVar3;
            }
            (p_dec->vsh).enable_nsip = (byte)_out;
            MVar3 = mpp_read_bits(bitctx,1,&_out);
            (p_dec->bitctx).ret = MVar3;
            if (MVar3 == MPP_OK) {
              (p_dec->vsh).enable_2nd_transform = (byte)_out;
              MVar3 = mpp_read_bits(bitctx,1,&_out);
              (p_dec->bitctx).ret = MVar3;
              if (MVar3 != MPP_OK) {
                return MVar3;
              }
              (p_dec->vsh).enable_sao = (byte)_out;
              MVar3 = mpp_read_bits(bitctx,1,&_out);
              (p_dec->bitctx).ret = MVar3;
              if (MVar3 != MPP_OK) {
                return MVar3;
              }
              (p_dec->vsh).enable_alf = (byte)_out;
              MVar3 = mpp_read_bits(bitctx,1,&_out);
              (p_dec->bitctx).ret = MVar3;
              if (MVar3 != MPP_OK) {
                return MVar3;
              }
              (p_dec->vsh).enable_pmvr = (byte)_out;
              MVar3 = mpp_read_bits(bitctx,1,&_out);
              (p_dec->bitctx).ret = MVar3;
              if ((MVar3 == MPP_OK) && ((byte)_out != '\x01')) {
                if (((byte)avs2d_parse_debug & 4) != 0) {
                  _mpp_log_l(4,"avs2d_ps","expected marker_bit 1 while received 0(%d).\n",
                             (char *)0x0,0x176);
                }
              }
              else if (MVar3 != MPP_OK) {
                return MVar3;
              }
              MVar3 = mpp_read_bits(bitctx,6,&_out);
              (p_dec->bitctx).ret = MVar3;
              if (MVar3 == MPP_OK) {
                (p_dec->vsh).num_of_rps = (byte)_out;
                rps = (p_dec->vsh).seq_rps;
                uVar7 = 0;
                MVar3 = MPP_OK;
                while (uVar7 < (p_dec->vsh).num_of_rps) {
                  if (((byte)avs2d_parse_debug & 8) != 0) {
                    _mpp_log_l(4,"avs2d_ps","--------rcs[%d]--------","avs2d_parse_sequence_header",
                               uVar7 & 0xffffffff);
                  }
                  MVar3 = parse_one_rps(bitctx,rps);
                  uVar7 = uVar7 + 1;
                  rps = rps + 1;
                  if (MVar3 < MPP_OK) {
                    if (((byte)avs2d_parse_debug & 4) != 0) {
                      _mpp_log_l(4,"avs2d_ps","Function error(%d).\n",(char *)0x0,0x17d);
                      return MVar3;
                    }
                    return MVar3;
                  }
                }
                if ((p_dec->vsh).low_delay == '\0') {
                  MVar5 = mpp_read_bits(bitctx,5,&_out);
                  (p_dec->bitctx).ret = MVar5;
                  if (MVar5 != MPP_OK) {
                    return MVar5;
                  }
                  (p_dec->vsh).picture_reorder_delay = (byte)_out;
                }
                else {
                  (p_dec->vsh).picture_reorder_delay = '\0';
                }
                MVar5 = mpp_read_bits(bitctx,1,&_out);
                (p_dec->bitctx).ret = MVar5;
                if (MVar5 == MPP_OK) {
                  (p_dec->vsh).enable_clf = (byte)_out;
                  MVar5 = mpp_read_bits(bitctx,2,&_out);
                  (p_dec->bitctx).ret = MVar5;
                  if (MVar5 != MPP_OK) {
                    return MVar5;
                  }
                  if (_out != 0) {
                    if (((byte)avs2d_parse_debug & 4) != 0) {
                      _mpp_log_l(4,"avs2d_ps","reserver bits error.\n",(char *)0x0);
                      return MVar3;
                    }
                    return MVar3;
                  }
                  return MVar3;
                }
                return MVar5;
              }
              return MVar3;
            }
            return MVar3;
          }
          uVar7 = (ulong)(_out & 0xff);
          fmt = "invalid lcu size: %d\n";
        }
      }
      else {
        uVar7 = (ulong)(_out & 0xff);
        fmt = "chroma_format 0x%02x is not supported.\n";
      }
    }
    else {
      uVar7 = (ulong)(_out & 0xff);
      fmt = "level_id 0x%02x is not supported.\n";
    }
  }
  else {
    fmt = "profile_id 0x%02x is not supported.\n";
  }
  _mpp_log_l(2,"avs2d_ps",fmt,"avs2d_parse_sequence_header",uVar7);
  return MPP_NOK;
}

Assistant:

MPP_RET avs2d_parse_sequence_header(Avs2dCtx_t *p_dec)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i;
    RK_U32 val_temp = 0;
    Avs2dRps_t *rps = NULL;
    BitReadCtx_t *bitctx = &p_dec->bitctx;
    Avs2dSeqHeader_t *vsh = &p_dec->vsh;

    AVS2D_PARSE_TRACE("Bitread buf %p, data %p, buf_len %d, left %d\n", bitctx->buf, bitctx->data_, bitctx->buf_len, bitctx->bytes_left_);
    memset(vsh, 0, sizeof(Avs2dSeqHeader_t));
    READ_BITS(bitctx, 8, &vsh->profile_id);
    //!< check profile_id
    if (vsh->profile_id != 0x12 && vsh->profile_id != 0x20 && vsh->profile_id != 0x22) {
        ret = MPP_NOK;
        mpp_err_f("profile_id 0x%02x is not supported.\n", vsh->profile_id);
        goto __FAILED;
    }
    READ_BITS(bitctx, 8, &vsh->level_id);
    if (vsh->level_id > 0x6A) {
        ret = MPP_NOK;
        mpp_err_f("level_id 0x%02x is not supported.\n", vsh->level_id);
        goto __FAILED;
    }
    READ_ONEBIT(bitctx, &vsh->progressive_sequence);
    READ_ONEBIT(bitctx, &vsh->field_coded_sequence);
    READ_BITS(bitctx, 14, &vsh->horizontal_size);
    READ_BITS(bitctx, 14, &vsh->vertical_size);
    if (vsh->horizontal_size < 16 || vsh->vertical_size < 16) {
        ret = MPP_NOK;
        mpp_err_f("invalid sequence width(%d), height(%d).\n",
                  vsh->horizontal_size, vsh->vertical_size);
        goto __FAILED;
    }

    READ_BITS(bitctx, 2,  &vsh->chroma_format);
    if (vsh->chroma_format != CHROMA_420) {
        ret = MPP_NOK;
        mpp_err_f("chroma_format 0x%02x is not supported.\n", vsh->chroma_format);
        goto __FAILED;
    }
    READ_BITS(bitctx, 3, &vsh->sample_precision);
    if (vsh->profile_id == MAIN10_PROFILE) {
        READ_BITS(bitctx, 3, &vsh->encoding_precision);
    } else {
        vsh->encoding_precision = 1;
    }
    vsh->bit_depth = 6 + (vsh->encoding_precision << 1);

    if (vsh->sample_precision < 1 || vsh->sample_precision > 2) {
        ret = MPP_NOK;
        mpp_err_f("sample_precision 0x%02x is not supported.\n", vsh->sample_precision);
        goto __FAILED;
    }
    if (vsh->encoding_precision < 1 || vsh->encoding_precision > 2) {
        ret = MPP_NOK;
        mpp_err_f("encoding_precision 0x%02x is not supported.\n", vsh->encoding_precision);
        goto __FAILED;
    }

    READ_BITS(bitctx, 4, &vsh->aspect_ratio);
    READ_BITS(bitctx, 4, &vsh->frame_rate_code);
    READ_BITS(bitctx, 18, &val_temp); //!< bit_rate_lower_18
    vsh->bit_rate = val_temp << 12;
    READ_MARKER_BIT(bitctx);
    READ_BITS(bitctx, 12, &val_temp); //!< bit_rate_upper_12
    vsh->bit_rate += val_temp;
    READ_ONEBIT(bitctx, &vsh->low_delay);
    READ_MARKER_BIT(bitctx);
    READ_ONEBIT(bitctx, &vsh->enable_temporal_id);
    READ_BITS(bitctx, 18, &vsh->bbv_buffer_size);
    READ_BITS(bitctx, 3, &vsh->lcu_size);
    if (vsh->lcu_size < 4 || vsh->lcu_size > 6) {
        ret = MPP_NOK;
        mpp_err_f("invalid lcu size: %d\n", vsh->lcu_size);
        goto __FAILED;
    }

    READ_ONEBIT(bitctx, &vsh->enable_weighted_quant);
    if (vsh->enable_weighted_quant) {
        parse_sequence_wqm(bitctx, vsh);
    }

    READ_ONEBIT(bitctx, &val_temp);
    vsh->enable_background_picture = val_temp ^ 0x01;
    READ_ONEBIT(bitctx, &vsh->enable_mhp_skip);
    READ_ONEBIT(bitctx, &vsh->enable_dhp);
    READ_ONEBIT(bitctx, &vsh->enable_wsm);
    READ_ONEBIT(bitctx, &vsh->enable_amp);
    READ_ONEBIT(bitctx, &vsh->enable_nsqt);
    READ_ONEBIT(bitctx, &vsh->enable_nsip);
    READ_ONEBIT(bitctx, &vsh->enable_2nd_transform);
    READ_ONEBIT(bitctx, &vsh->enable_sao);
    READ_ONEBIT(bitctx, &vsh->enable_alf);
    READ_ONEBIT(bitctx, &vsh->enable_pmvr);
    READ_MARKER_BIT(bitctx);

    //!< parse rps
    READ_BITS(bitctx, 6, &vsh->num_of_rps);
    for (i = 0; i < vsh->num_of_rps; i++) {
        rps = &vsh->seq_rps[i];
        AVS2D_PARSE_TRACE("--------rcs[%d]--------", i);
        FUN_CHECK(ret = parse_one_rps(bitctx, rps));
    }

    if (vsh->low_delay == 0) {
        READ_BITS(bitctx, 5, &vsh->picture_reorder_delay);
    } else {
        vsh->picture_reorder_delay = 0;
    }
    READ_ONEBIT(bitctx, &vsh->enable_clf);
    READ_BITS(bitctx, 2, &val_temp); //!< reserved 2bits 00
    if (val_temp) {
        AVS2D_DBG(AVS2D_DBG_WARNNING, "reserver bits error.\n");
    }
    return ret;
__BITREAD_ERR:
    return ret = bitctx->ret;
__FAILED:
    return ret;
}